

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O3

void __thiscall DummyTest_Copy_Test::~DummyTest_Copy_Test(DummyTest_Copy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DummyTest, Copy) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
    }

    Deque<int> d2(d);
    auto p = std::mismatch(d.begin(), d.end(), d2.begin());
    ASSERT_EQ(p.first, d.end());

    d[3] = 5;
    ASSERT_NE(d[3], d2[3]);
}